

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::VIAPortHandler::VIAPortHandler
          (VIAPortHandler *this,AsyncTaskQueue<false,_true,_void> *audio_queue,AY *ay8910,
          Speaker *speaker,TapePlayer *tape_player,Keyboard *keyboard)

{
  Joystick *pJVar1;
  Joystick *local_58 [3];
  Joystick *local_40;
  Keyboard *local_38;
  Keyboard *keyboard_local;
  TapePlayer *tape_player_local;
  Speaker *speaker_local;
  AY *ay8910_local;
  AsyncTaskQueue<false,_true,_void> *audio_queue_local;
  VIAPortHandler *this_local;
  
  local_38 = keyboard;
  keyboard_local = (Keyboard *)tape_player;
  tape_player_local = (TapePlayer *)speaker;
  speaker_local = (Speaker *)ay8910;
  ay8910_local = (AY *)audio_queue;
  audio_queue_local = (AsyncTaskQueue<false,_true,_void> *)this;
  MOS::MOS6522::IRQDelegatePortHandler::IRQDelegatePortHandler(&this->super_IRQDelegatePortHandler);
  this->ay_bdir_ = false;
  this->ay_bc1_ = false;
  this->porta_output_ = 0xff;
  HalfCycles::HalfCycles(&this->cycles_since_ay_update_);
  this->audio_queue_ = (AsyncTaskQueue<false,_true,_void> *)ay8910_local;
  this->ay8910_ = (AY *)speaker_local;
  this->speaker_ = (Speaker *)tape_player_local;
  this->tape_player_ = (TapePlayer *)keyboard_local;
  this->keyboard_ = local_38;
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::vector(&this->joysticks_);
  pJVar1 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_bb8899::Joystick::Joystick(pJVar1);
  local_40 = pJVar1;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_40);
  pJVar1 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_bb8899::Joystick::Joystick(pJVar1);
  local_58[0] = pJVar1;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,local_58);
  return;
}

Assistant:

VIAPortHandler(Concurrency::AsyncTaskQueue<false> &audio_queue, AY &ay8910, Speaker &speaker, TapePlayer &tape_player, Keyboard &keyboard) :
			audio_queue_(audio_queue), ay8910_(ay8910), speaker_(speaker), tape_player_(tape_player), keyboard_(keyboard)
		{
			// Attach a couple of joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);
		}